

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

ConstraintBlockSyntax * __thiscall
slang::parsing::Parser::parseConstraintBlock(Parser *this,bool isTopLevel)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  int iVar3;
  Diagnostic *this_00;
  SourceLocation SVar4;
  undefined4 extraout_var;
  ConstraintBlockSyntax *pCVar5;
  byte bVar6;
  byte bVar7;
  Token TVar8;
  SourceRange range;
  string_view arg;
  Token openBrace;
  ConstraintItemSyntax *member;
  Token closeBrace;
  SmallVector<slang::syntax::ConstraintItemSyntax_*,_8UL> members;
  Token local_d0;
  ConstraintItemSyntax *local_c0;
  Token local_b8;
  Token *local_a8;
  Token *local_a0;
  Info *local_98;
  undefined8 local_90;
  SyntaxList<slang::syntax::ConstraintItemSyntax> local_88;
  
  Token::Token(&local_b8);
  TVar8 = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  local_88.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&local_88.super_SyntaxListBase.super_SyntaxNode.previewNode;
  local_88.super_SyntaxListBase.super_SyntaxNode.kind = Unknown;
  local_88.super_SyntaxListBase.super_SyntaxNode._4_4_ = 0;
  local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x8;
  local_a0 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_a8 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar6 = 0;
  do {
    local_98 = TVar8.info;
    local_90 = TVar8._0_8_;
    TVar8 = ParserBase::peek(&this->super_ParserBase);
    bVar2 = false;
    if ((TVar8.kind != EndOfFile) && ((TVar8._0_4_ & 0xffff) != 0xe)) {
      local_c0 = parseConstraintItem(this,false,isTopLevel);
      if (local_c0 == (ConstraintItemSyntax *)0x0) {
        bVar2 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar8.kind);
        if (bVar2) {
          local_d0 = ParserBase::peek(&this->super_ParserBase);
          range = Token::range(&local_d0);
          this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
          local_d0 = ParserBase::peek(&this->super_ParserBase);
          arg = Token::valueText(&local_d0);
          Diagnostic::operator<<(this_00,arg);
          bVar6 = 1;
          if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
             ((this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
            SVar4 = Token::location(local_a0);
            Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar4);
            SVar4 = Token::location(local_a8);
            Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar4);
          }
        }
        bVar7 = ~bVar6;
        bVar6 = 1;
        ParserBase::skipToken
                  (&this->super_ParserBase,
                   (optional<slang::DiagCode>)((uint6)(bVar7 & 1) << 0x20 | 0x450005));
      }
      else {
        SmallVectorBase<slang::syntax::ConstraintItemSyntax*>::
        emplace_back<slang::syntax::ConstraintItemSyntax*const&>
                  ((SmallVectorBase<slang::syntax::ConstraintItemSyntax*> *)&local_88,&local_c0);
        pSVar1 = this->previewNode;
        this->previewNode = (SyntaxNode *)0x0;
        (local_c0->super_SyntaxNode).previewNode = pSVar1;
        bVar6 = 0;
      }
      bVar2 = true;
    }
    TVar8.info = local_98;
    TVar8.kind = (undefined2)local_90;
    TVar8._2_1_ = local_90._2_1_;
    TVar8.numFlags.raw = local_90._3_1_;
    TVar8.rawLen = local_90._4_4_;
  } while (bVar2);
  local_b8 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
  iVar3 = SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::ConstraintItemSyntax_*> *)&local_88,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)local_b8.info);
  local_88.super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)CONCAT44(extraout_var,iVar3);
  if ((SyntaxNode **)local_88.super_SyntaxListBase._vptr_SyntaxListBase !=
      &local_88.super_SyntaxListBase.super_SyntaxNode.previewNode) {
    operator_delete(local_88.super_SyntaxListBase._vptr_SyntaxListBase);
  }
  local_88.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_88.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_88.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e6518;
  openBrace.info = local_98;
  openBrace.kind = (undefined2)local_90;
  openBrace._2_1_ = local_90._2_1_;
  openBrace.numFlags.raw = local_90._3_1_;
  openBrace.rawLen = local_90._4_4_;
  pCVar5 = slang::syntax::SyntaxFactory::constraintBlock
                     (&this->factory,openBrace,&local_88,local_b8);
  return pCVar5;
}

Assistant:

ConstraintBlockSyntax& Parser::parseConstraintBlock(bool isTopLevel) {
    Token closeBrace;
    auto openBrace = expect(TokenKind::OpenBrace);
    auto members = parseMemberList<ConstraintItemSyntax>(
        TokenKind::CloseBrace, closeBrace, SyntaxKind::ConstraintBlock,
        [this, isTopLevel](SyntaxKind, bool&) { return parseConstraintItem(false, isTopLevel); });

    return factory.constraintBlock(openBrace, members, closeBrace);
}